

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Options.h
# Opt level: O0

void __thiscall Minisat::DoubleOption::help(DoubleOption *this,bool verbose)

{
  char local_39;
  char local_12;
  bool verbose_local;
  DoubleOption *this_local;
  
  local_12 = '[';
  if (((this->range).begin_inclusive & 1U) == 0) {
    local_12 = '(';
  }
  local_39 = ']';
  if (((this->range).end_inclusive & 1U) == 0) {
    local_39 = ')';
  }
  fprintf(_stderr,"  -%-12s = %-8s %c%4.2g .. %4.2g%c (default: %g)\n",(this->range).begin,
          (this->range).end,this->value,(this->super_Option).name,(this->super_Option).type_name,
          (ulong)(uint)(int)local_12,(ulong)(uint)(int)local_39);
  if (verbose) {
    fprintf(_stderr,"\n        %s\n",(this->super_Option).description);
    fprintf(_stderr,"\n");
  }
  return;
}

Assistant:

virtual void help (bool verbose = false){
        fprintf(stderr, "  -%-12s = %-8s %c%4.2g .. %4.2g%c (default: %g)\n",
                name, type_name,
                range.begin_inclusive ? '[' : '(',
                range.begin,
                range.end,
                range.end_inclusive ? ']' : ')',
                value);
        if (verbose){
            fprintf(stderr, "\n        %s\n", description);
            fprintf(stderr, "\n");
        }
    }